

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

QString * __thiscall QCompleter::pathFromIndex(QCompleter *this,QModelIndex *index)

{
  bool bVar1;
  QCompleterPrivate *pQVar2;
  long *plVar3;
  QFileSystemModel *pQVar4;
  qsizetype qVar5;
  QModelIndex *in_RDX;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  bool isFsModel;
  QAbstractItemModel *sourceModel;
  QCompleterPrivate *d;
  QModelIndex parent;
  QString t;
  QStringList list;
  QModelIndex idx;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  QModelIndex *this_00;
  undefined6 in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffefe;
  QChar sep;
  undefined8 local_d8;
  quintptr local_d0;
  QAbstractItemModel *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_b0;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  QList<QString> local_78;
  undefined8 local_60;
  quintptr local_58;
  QAbstractItemModel *local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = d_func((QCompleter *)0xa6fc02);
  bVar1 = QModelIndex::isValid(in_RDI);
  if (bVar1) {
    plVar3 = (long *)QAbstractProxyModel::sourceModel();
    if (plVar3 == (long *)0x0) {
      QString::QString((QString *)0xa6fc4c);
    }
    else {
      QAbstractProxyModel::sourceModel();
      pQVar4 = qobject_cast<QFileSystemModel*>((QObject *)0xa6fc6f);
      sep.ucs = CONCAT11(pQVar4 != (QFileSystemModel *)0x0,in_stack_fffffffffffffefe);
      if (pQVar4 != (QFileSystemModel *)0x0) {
        local_60._0_4_ = in_RDX->r;
        local_60._4_4_ = in_RDX->c;
        local_58 = in_RDX->i;
        local_50 = (in_RDX->m).ptr;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QList<QString>::QList((QList<QString> *)0xa6fd5c);
        do {
          local_90 = &DAT_aaaaaaaaaaaaaaaa;
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          QString::QString((QString *)0xa6fd96);
          (**(code **)(*plVar3 + 0x90))(&local_48,plVar3,&local_60,0x102);
          ::QVariant::toString();
          QString::operator=((QString *)in_RDI,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          QString::~QString((QString *)0xa6fdf0);
          ::QVariant::~QVariant(&local_48);
          QList<QString>::prepend
                    ((QList<QString> *)in_RDI,
                     (parameter_type)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          local_c0 = &DAT_aaaaaaaaaaaaaaaa;
          local_b8 = &DAT_aaaaaaaaaaaaaaaa;
          local_b0.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          QModelIndex::parent((QModelIndex *)
                              CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0));
          in_stack_fffffffffffffedc = QModelIndex::row((QModelIndex *)&local_c0);
          QModelIndex::column(in_RDX);
          QModelIndex::sibling
                    ((QModelIndex *)CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),
                     (int)((ulong)this_00 >> 0x20),(int)this_00);
          local_60 = local_d8;
          local_58 = local_d0;
          local_50 = local_c8;
          QString::~QString((QString *)0xa6fea9);
          bVar1 = QModelIndex::isValid(in_RDI);
        } while (bVar1);
        qVar5 = QList<QString>::size(&local_78);
        if (qVar5 == 1) {
          QList<QString>::operator[]
                    ((QList<QString> *)in_RDI,
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          QString::QString((QString *)in_RDI,
                           (QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
          ;
        }
        else {
          QList<QString>::operator[]
                    ((QList<QString> *)in_RDI,
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          QString::clear((QString *)in_RDI);
          QDir::separator();
          QListSpecialMethods<QString>::join((QListSpecialMethods<QString> *)this_00,sep);
        }
        QList<QString>::~QList((QList<QString> *)0xa6ff48);
      }
      else {
        (**(code **)(*plVar3 + 0x90))(&local_28,plVar3,in_RDX,pQVar2->role);
        ::QVariant::toString();
        ::QVariant::~QVariant(&local_28);
      }
    }
  }
  else {
    QString::QString((QString *)0xa6fc1f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QCompleter::pathFromIndex(const QModelIndex& index) const
{
    Q_D(const QCompleter);
    if (!index.isValid())
        return QString();

    QAbstractItemModel *sourceModel = d->proxy->sourceModel();
    if (!sourceModel)
        return QString();
    bool isFsModel = false;
#if QT_CONFIG(filesystemmodel)
    isFsModel = qobject_cast<QFileSystemModel *>(d->proxy->sourceModel()) != nullptr;
#endif
    if (!isFsModel)
        return sourceModel->data(index, d->role).toString();

    QModelIndex idx = index;
    QStringList list;
    do {
        QString t;
#if QT_CONFIG(filesystemmodel)
        t = sourceModel->data(idx, QFileSystemModel::FileNameRole).toString();
#endif
        list.prepend(t);
        QModelIndex parent = idx.parent();
        idx = parent.sibling(parent.row(), index.column());
    } while (idx.isValid());

#if !defined(Q_OS_WIN)
    if (list.size() == 1) // only the separator or some other text
        return list[0];
    list[0].clear() ; // the join below will provide the separator
#endif

    return list.join(QDir::separator());
}